

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O3

void JSON::writeClose(Pipeline *p,bool first,size_t depth,char *delimiter)

{
  undefined7 in_register_00000031;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string s;
  string local_68;
  long *local_48;
  ulong local_40;
  long local_38 [2];
  
  if ((int)CONCAT71(in_register_00000031,first) != 0) {
    Pipeline::operator<<(p,delimiter);
    return;
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"\n","");
  std::__cxx11::string::_M_replace_aux((ulong)&local_48,local_40,0,(char)depth * '\x02');
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_48,local_40 + (long)local_48);
  std::__cxx11::string::append((char *)&local_68);
  Pipeline::operator<<(p,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void
JSON::writeClose(Pipeline* p, bool first, size_t depth, char const* delimiter)
{
    if (first) {
        *p << delimiter;
    } else {
        std::string s{"\n"};
        s.append(2 * depth, ' ');
        *p << s + delimiter;
    }
}